

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChunkV.cpp
# Opt level: O0

BufferPos * __thiscall adios2::format::ChunkV::Allocate(ChunkV *this,size_t size,size_t align)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
  *in_RDX;
  long in_RSI;
  ChunkV *in_RDI;
  VecEntry entry;
  Chunk c_1;
  size_t NewSize;
  size_t bufferPos;
  VecEntry *dv;
  char *p;
  size_t alignment;
  size_t actualsize;
  Chunk *c;
  bool AppendPossible;
  char *in_stack_ffffffffffffff28;
  vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
  *in_stack_ffffffffffffff30;
  vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
  *pvVar4;
  value_type *in_stack_ffffffffffffff38;
  vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
  *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined1 uVar5;
  ChunkV *this_00;
  undefined1 local_78 [24];
  vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
  *local_60;
  size_t local_58;
  reference local_50;
  undefined4 local_44;
  char *local_40;
  long local_38;
  size_t local_30;
  reference local_28;
  bool local_19;
  vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
  *local_10;
  
  if (in_RDX == (vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                 *)0x0) {
    BufferV::BufferPos::BufferPos((BufferPos *)in_RDI,-1,0,*(size_t *)(in_RSI + 0x70));
    this_00 = in_RDI;
  }
  else {
    this_00 = in_RDI;
    local_10 = in_RDX;
    BufferV::AlignBuffer
              (&in_RDI->super_BufferV,CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48))
    ;
    sVar1 = std::
            vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
            ::size((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                    *)(in_RSI + 0x58));
    uVar5 = false;
    if (sVar1 != 0) {
      pvVar2 = std::
               vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
               ::back(in_stack_ffffffffffffff30);
      uVar5 = false;
      if ((pvVar2->External & 1U) == 0) {
        in_stack_ffffffffffffff38 =
             (value_type *)(**(long **)(in_RSI + 0xa8) + *(long *)(in_RSI + 0xa0));
        pvVar2 = std::
                 vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                 ::back(in_stack_ffffffffffffff30);
        in_stack_ffffffffffffff40 =
             (vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
              *)((long)in_stack_ffffffffffffff38 - pvVar2->Size);
        pvVar2 = std::
                 vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                 ::back(in_stack_ffffffffffffff30);
        uVar5 = in_stack_ffffffffffffff40 ==
                (vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                 *)pvVar2->Base;
      }
    }
    local_19 = (bool)uVar5;
    if (((bool)uVar5 != false) &&
       (*(ulong *)(in_RSI + 0x80) <
        (ulong)((long)&(local_10->
                       super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                       )._M_impl.super__Vector_impl_data._M_start + *(long *)(in_RSI + 0xa0)))) {
      local_28 = std::
                 vector<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
                 ::back((vector<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
                         *)in_stack_ffffffffffffff30);
      local_30 = ChunkAlloc(this_00,(Chunk *)in_RDI,CONCAT17(uVar5,in_stack_ffffffffffffff48));
      local_38 = local_30 - *(long *)(in_RSI + 0xa0);
      if (local_38 != 0) {
        local_40 = local_28->Ptr + *(long *)(in_RSI + 0xa0);
        local_44 = 0;
        std::fill<char*,int>
                  ((char *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(int *)0xada0c4);
        *(long *)(in_RSI + 0x70) = local_38 + *(long *)(in_RSI + 0x70);
      }
      local_50 = std::
                 vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                 ::back(in_stack_ffffffffffffff30);
      local_50->Size = local_30;
      local_50->Base = local_28->Ptr;
      *(undefined8 *)(in_RSI + 0xa0) = 0;
      *(undefined8 *)(in_RSI + 0xa8) = 0;
      local_19 = false;
    }
    local_58 = 0;
    if (local_19 == false) {
      local_60 = *(vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                   **)(in_RSI + 0x80);
      if (*(vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
            **)(in_RSI + 0x80) < local_10) {
        local_60 = local_10;
      }
      memset(local_78,0,0x18);
      ChunkAlloc(this_00,(Chunk *)in_RDI,CONCAT17(uVar5,in_stack_ffffffffffffff48));
      std::vector<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>::
      push_back((vector<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
                 *)in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
      pvVar3 = std::
               vector<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
               ::back((vector<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
                       *)in_stack_ffffffffffffff30);
      *(reference *)(in_RSI + 0xa8) = pvVar3;
      local_58 = 0;
      *(vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
        **)(in_RSI + 0xa0) = local_10;
      std::
      vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
      ::push_back(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    else {
      local_58 = *(size_t *)(in_RSI + 0xa0);
      pvVar4 = local_10;
      pvVar2 = std::
               vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
               ::back(local_10);
      pvVar2->Size = (long)&(pvVar4->
                            super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                            )._M_impl.super__Vector_impl_data._M_start + pvVar2->Size;
      *(long *)(in_RSI + 0xa0) =
           (long)&(local_10->
                  super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                  )._M_impl.super__Vector_impl_data._M_start + *(long *)(in_RSI + 0xa0);
    }
    sVar1 = std::
            vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
            ::size((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                    *)(in_RSI + 0x58));
    BufferV::BufferPos::BufferPos
              ((BufferPos *)in_RDI,(int)sVar1 + -1,local_58,*(size_t *)(in_RSI + 0x70));
    *(long *)(in_RSI + 0x70) =
         (long)&(local_10->
                super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                )._M_impl.super__Vector_impl_data._M_start + *(long *)(in_RSI + 0x70);
  }
  return (BufferPos *)this_00;
}

Assistant:

BufferV::BufferPos ChunkV::Allocate(const size_t size, size_t align)
{
    /*std::cout << "  Allocate: size = " << size << " align = " << align
              << std::endl;*/
    if (size == 0)
    {
        return BufferPos(-1, 0, CurOffset);
    }

    AlignBuffer(align);

    // we can possibly append this entry to the last if the last was
    // internal
    bool AppendPossible =
        DataV.size() && !DataV.back().External &&
        (m_TailChunk->Ptr + m_TailChunkPos - DataV.back().Size == DataV.back().Base);

    if (AppendPossible && (m_TailChunkPos + size > m_ChunkSize))
    {
        // No room in current chunk, close it out
        // realloc down to used size (helpful?) and set size in array
        Chunk &c = m_Chunks.back();
        size_t actualsize = ChunkAlloc(c, m_TailChunkPos);
        size_t alignment = actualsize - m_TailChunkPos;
        if (alignment)
        {
            auto p = c.Ptr + m_TailChunkPos;
            std::fill(p, p + alignment, 0);
            CurOffset += alignment;
        }
        // Update entry in DataV as size and potentiall ptr has changed
        // Learned from sanitizer: downsizing realloc still may change pointer
        VecEntry &dv = DataV.back();
        dv.Size = actualsize;
        dv.Base = c.Ptr;
        m_TailChunkPos = 0;
        m_TailChunk = nullptr;
        AppendPossible = false;
    }

    size_t bufferPos = 0;
    if (AppendPossible)
    {
        // We can use current chunk, just append the data;
        bufferPos = m_TailChunkPos;
        DataV.back().Size += size;
        m_TailChunkPos += size;
    }
    else
    {
        // We need a new chunk, get the larger of size or m_ChunkSize
        size_t NewSize = m_ChunkSize;
        if (size > m_ChunkSize)
            NewSize = size;
        Chunk c{nullptr, nullptr, 0};
        ChunkAlloc(c, NewSize);
        m_Chunks.push_back(c);
        m_TailChunk = &m_Chunks.back();
        bufferPos = 0;
        m_TailChunkPos = size;
        VecEntry entry = {false, m_TailChunk->Ptr, 0, size};
        DataV.push_back(entry);
    }

    BufferPos bp(static_cast<int>(DataV.size() - 1), bufferPos, CurOffset);
    // valid ptr anytime <-- DataV[idx] + bufferPos;

    CurOffset += size;

    return bp;
}